

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void __thiscall Compressor::Impl::getPalettes(Impl *this,Image *image,int *p1,int *p2)

{
  bool bVar1;
  mapped_type *pmVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
  *in_RDI;
  Color p2c;
  Color *c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Color,_std::allocator<Color>_> *__range1;
  undefined4 in_stack_ffffffffffffff88;
  mapped_type in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8d;
  mapped_type in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  _Node_iterator_base<std::pair<const_Color,_unsigned_char>,_true> local_68;
  _Node_iterator_base<std::pair<const_Color,_unsigned_char>,_true> local_60;
  _Node_iterator_base<std::pair<const_Color,_unsigned_char>,_true> local_58;
  _Node_iterator_base<std::pair<const_Color,_unsigned_char>,_true> local_50;
  uint local_44;
  reference local_40;
  Color *local_38;
  __normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_> local_30;
  long local_28;
  int *local_20;
  int *local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
  ::clear((unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
           *)0x10ca17);
  std::
  unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
  ::clear((unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
           *)0x10ca25);
  *local_20 = 0;
  *local_18 = 0;
  local_28 = local_10 + 8;
  local_30._M_current =
       (Color *)std::vector<Color,_std::allocator<Color>_>::begin
                          ((vector<Color,_std::allocator<Color>_> *)
                           CONCAT17(in_stack_ffffffffffffff8f,
                                    CONCAT16(in_stack_ffffffffffffff8e,
                                             CONCAT15(in_stack_ffffffffffffff8d,
                                                      CONCAT14(in_stack_ffffffffffffff8c,
                                                               in_stack_ffffffffffffff88)))));
  local_38 = (Color *)std::vector<Color,_std::allocator<Color>_>::end
                                ((vector<Color,_std::allocator<Color>_> *)
                                 CONCAT17(in_stack_ffffffffffffff8f,
                                          CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT15(in_stack_ffffffffffffff8d,
                                                            CONCAT14(in_stack_ffffffffffffff8c,
                                                                     in_stack_ffffffffffffff88)))));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff8f,
                                        CONCAT16(in_stack_ffffffffffffff8e,
                                                 CONCAT15(in_stack_ffffffffffffff8d,
                                                          CONCAT14(in_stack_ffffffffffffff8c,
                                                                   in_stack_ffffffffffffff88))))),
        bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>::
               operator*(&local_30);
    local_44 = (uint)*local_40 & 0xffffff;
    in_stack_ffffffffffffff8f = false;
    if (-1 < *local_20) {
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
           ::find((unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
                   *)(ulong)CONCAT16(in_stack_ffffffffffffff8e,
                                     CONCAT15(in_stack_ffffffffffffff8d,
                                              CONCAT14(in_stack_ffffffffffffff8c,
                                                       in_stack_ffffffffffffff88))),
                  (key_type *)0x10cac1);
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
           ::end((unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff8f,
                             CONCAT16(in_stack_ffffffffffffff8e,
                                      CONCAT15(in_stack_ffffffffffffff8d,
                                               CONCAT14(in_stack_ffffffffffffff8c,
                                                        in_stack_ffffffffffffff88)))));
      in_stack_ffffffffffffff8f = std::__detail::operator==(&local_50,&local_58);
    }
    if ((bool)in_stack_ffffffffffffff8f != false) {
      if (*local_20 == 0x100) {
        *local_20 = -1;
      }
      else {
        in_stack_ffffffffffffff8e = (mapped_type)*local_20;
        pmVar2 = std::
                 unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
                 ::operator[](in_RDI,(key_type *)
                                     CONCAT17(in_stack_ffffffffffffff8f,
                                              CONCAT16(in_stack_ffffffffffffff8e,
                                                       CONCAT15(in_stack_ffffffffffffff8d,
                                                                CONCAT14(in_stack_ffffffffffffff8c,
                                                                         in_stack_ffffffffffffff88))
                                                      )));
        *pmVar2 = in_stack_ffffffffffffff8e;
        *local_20 = *local_20 + 1;
      }
    }
    in_stack_ffffffffffffff8d = false;
    if (-1 < *local_18) {
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
           ::find((unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,
                                       (uint6)CONCAT14(in_stack_ffffffffffffff8c,
                                                       in_stack_ffffffffffffff88))),
                  (key_type *)0x10cb61);
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
           ::end((unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff8f,
                             CONCAT16(in_stack_ffffffffffffff8e,
                                      CONCAT15(in_stack_ffffffffffffff8d,
                                               CONCAT14(in_stack_ffffffffffffff8c,
                                                        in_stack_ffffffffffffff88)))));
      in_stack_ffffffffffffff8d = std::__detail::operator==(&local_60,&local_68);
    }
    if ((bool)in_stack_ffffffffffffff8d != false) {
      if (*local_18 == 0x100) {
        *local_18 = -1;
      }
      else {
        in_stack_ffffffffffffff8c = (mapped_type)*local_18;
        pmVar2 = std::
                 unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
                 ::operator[](in_RDI,(key_type *)
                                     CONCAT17(in_stack_ffffffffffffff8f,
                                              CONCAT16(in_stack_ffffffffffffff8e,
                                                       CONCAT15(in_stack_ffffffffffffff8d,
                                                                CONCAT14(in_stack_ffffffffffffff8c,
                                                                         in_stack_ffffffffffffff88))
                                                      )));
        *pmVar2 = in_stack_ffffffffffffff8c;
        *local_18 = *local_18 + 1;
      }
    }
    __gnu_cxx::__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>::
    operator++(&local_30);
  }
  return;
}

Assistant:

void getPalettes(const Image& image, int& p1, int& p2) {
		palette1.clear();
		palette2.clear();
		p1 = p2 = 0;
		for (const Color& c : image.colorData) {
			Color p2c = c;
			p2c.a = 0;
			if (p2 >= 0 && palette2.find(p2c) == palette2.end()) {
				if (p2 == 256) {
					p2 = -1;
				} else {
					palette2[p2c] = p2;
					p2++;
				}
			}
			if (p1 >= 0 && palette1.find(c) == palette1.end()) {
				if (p1 == 256) {
					p1 = -1;
				} else {
					palette1[c] = p1;
					p1++;
				}
			}
		}
	}